

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_class.cpp
# Opt level: O2

void Omega_h::classify_by_angles(Mesh *mesh,Real sharp_angle)

{
  Int IVar1;
  LO LVar2;
  ulong uVar3;
  uint uVar4;
  LOs surf_hinge2hinge;
  Write<signed_char> hinge_is_sharp;
  LOs surf_side2side;
  Read<signed_char> hinge_is_exposed;
  Read<signed_char> side_is_exposed;
  Write<signed_char> local_1c8;
  Write<signed_char> local_1b8;
  Write<signed_char> local_1a8;
  Write<int> local_198;
  Write<int> local_188;
  Write<double> local_178;
  Reals surf_hinge_angles;
  Write<int> local_158;
  LOs side2surf_side;
  Write<signed_char> local_138;
  Write<int> local_128;
  Reals surf_side_normals;
  Write<signed_char> local_108;
  Write<signed_char> local_f8;
  Write<signed_char> local_e8;
  string local_d8;
  Write<signed_char> local_b8;
  double local_a8;
  Write<int> local_a0;
  Write<signed_char> local_90;
  Write<double> local_80;
  double local_70;
  type f;
  
  if (mesh->family_ == OMEGA_H_SIMPLEX) {
    IVar1 = Mesh::dim(mesh);
    classify_elements(mesh);
    mark_exposed_sides((Omega_h *)&side_is_exposed,mesh);
    Write<signed_char>::Write(&local_e8,(Write<signed_char> *)&side_is_exposed);
    classify_sides_by_exposure(mesh,(Read<signed_char> *)&local_e8);
    Write<signed_char>::~Write(&local_e8);
    if (IVar1 != 1) {
      Write<signed_char>::Write(&local_f8,&side_is_exposed.write_);
      mark_down((Omega_h *)&hinge_is_exposed,mesh,IVar1 + -1,IVar1 + -2,
                (Read<signed_char> *)&local_f8);
      Write<signed_char>::~Write(&local_f8);
      Write<signed_char>::Write(&local_108,&side_is_exposed.write_);
      collect_marked((Omega_h *)&surf_side2side,(Read<signed_char> *)&local_108);
      Write<signed_char>::~Write(&local_108);
      Write<int>::Write(&local_128,&surf_side2side.write_);
      get_side_vectors((Omega_h *)&surf_side_normals,mesh,(LOs *)&local_128);
      Write<int>::~Write(&local_128);
      Write<signed_char>::Write(&local_138,&hinge_is_exposed.write_);
      collect_marked((Omega_h *)&surf_hinge2hinge,(Read<signed_char> *)&local_138);
      Write<signed_char>::~Write(&local_138);
      if (((ulong)surf_hinge2hinge.write_.shared_alloc_.alloc & 1) == 0) {
        uVar3 = (surf_hinge2hinge.write_.shared_alloc_.alloc)->size;
      }
      else {
        uVar3 = (ulong)surf_hinge2hinge.write_.shared_alloc_.alloc >> 3;
      }
      LVar2 = Mesh::nents(mesh,IVar1 + -1);
      Write<int>::Write(&local_158,&surf_side2side.write_);
      invert_injective_map((Omega_h *)&side2surf_side,(LOs *)&local_158,LVar2);
      Write<int>::~Write(&local_158);
      Write<double>::Write(&local_178,&surf_side_normals.write_);
      Write<int>::Write(&local_188,&surf_hinge2hinge.write_);
      Write<int>::Write(&local_198,&side2surf_side.write_);
      get_hinge_angles((Omega_h *)&surf_hinge_angles,mesh,(Reals *)&local_178,(LOs *)&local_188,
                       (LOs *)&local_198);
      Write<int>::~Write(&local_198);
      Write<int>::~Write(&local_188);
      Write<double>::~Write(&local_178);
      LVar2 = Mesh::nents(mesh,IVar1 + -2);
      std::__cxx11::string::string((string *)&local_d8,"",(allocator *)&local_a0);
      Write<signed_char>::Write(&hinge_is_sharp,LVar2,'\0',&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      Write<int>::Write((Write<int> *)&f,&surf_hinge2hinge.write_);
      Write<signed_char>::Write(&f.hinge_is_sharp,&hinge_is_sharp);
      Write<double>::Write(&f.surf_hinge_angles.write_,&surf_hinge_angles.write_);
      f.sharp_angle = sharp_angle;
      Write<int>::Write(&local_a0,(Write<int> *)&f);
      Write<signed_char>::Write(&local_90,&f.hinge_is_sharp);
      Write<double>::Write(&local_80,&f.surf_hinge_angles.write_);
      local_70 = f.sharp_angle;
      uVar4 = (uint)(uVar3 >> 2);
      if (0 < (int)uVar4) {
        entering_parallel = 1;
        Write<int>::Write((Write<int> *)&local_d8,&local_a0);
        Write<signed_char>::Write((Write<signed_char> *)&local_d8.field_2,&local_90);
        Write<double>::Write(&local_b8,(Write<signed_char> *)&local_80);
        local_a8 = local_70;
        entering_parallel = 0;
        for (uVar3 = 0; (uVar4 & 0x7fffffff) != uVar3; uVar3 = uVar3 + 1) {
          *(bool *)(local_d8.field_2._8_8_ + (long)*(int *)(local_d8._M_string_length + uVar3 * 4))
               = local_70 <= *(double *)((long)local_b8.shared_alloc_.direct_ptr + uVar3 * 8);
        }
        classify_by_angles(Omega_h::Mesh*,double)::$_0::~__0((__0 *)&local_d8);
      }
      classify_by_angles(Omega_h::Mesh*,double)::$_0::~__0((__0 *)&local_a0);
      Write<signed_char>::Write(&local_1a8,&hinge_is_exposed.write_);
      Write<signed_char>::Write(&local_1c8,&hinge_is_sharp);
      Read<signed_char>::Read((Read<signed_char> *)&local_1b8,&local_1c8);
      classify_hinges_by_sharpness
                (mesh,(Read<signed_char> *)&local_1a8,(Read<signed_char> *)&local_1b8);
      Write<signed_char>::~Write(&local_1b8);
      Write<signed_char>::~Write(&local_1c8);
      Write<signed_char>::~Write(&local_1a8);
      if (IVar1 != 2) {
        finalize_classification(mesh);
      }
      classify_by_angles(Omega_h::Mesh*,double)::$_0::~__0((__0 *)&f);
      Write<signed_char>::~Write(&hinge_is_sharp);
      Write<double>::~Write(&surf_hinge_angles.write_);
      Write<int>::~Write(&side2surf_side.write_);
      Write<int>::~Write(&surf_hinge2hinge.write_);
      Write<double>::~Write(&surf_side_normals.write_);
      Write<int>::~Write(&surf_side2side.write_);
      Write<signed_char>::~Write(&hinge_is_exposed.write_);
    }
    Write<signed_char>::~Write(&side_is_exposed.write_);
    return;
  }
  fail("assertion %s failed at %s +%d\n","mesh->family() == OMEGA_H_SIMPLEX",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_class.cpp"
       ,0x2b);
}

Assistant:

void classify_by_angles(Mesh* mesh, Real sharp_angle) {
  OMEGA_H_CHECK(mesh->family() == OMEGA_H_SIMPLEX);
  auto dim = mesh->dim();
  classify_elements(mesh);
  auto side_is_exposed = mark_exposed_sides(mesh);
  classify_sides_by_exposure(mesh, side_is_exposed);
  if (dim == 1) return;
  auto hinge_is_exposed = mark_down(mesh, dim - 1, dim - 2, side_is_exposed);
  auto surf_side2side = collect_marked(side_is_exposed);
  auto surf_side_normals = get_side_vectors(mesh, surf_side2side);
  auto surf_hinge2hinge = collect_marked(hinge_is_exposed);
  auto nsurf_hinges = surf_hinge2hinge.size();
  auto nsides = mesh->nents(dim - 1);
  auto side2surf_side = invert_injective_map(surf_side2side, nsides);
  auto surf_hinge_angles = get_hinge_angles(
      mesh, surf_side_normals, surf_hinge2hinge, side2surf_side);
  auto nhinges = mesh->nents(dim - 2);
  Write<I8> hinge_is_sharp(nhinges, 0);
  auto f = OMEGA_H_LAMBDA(LO surf_hinge) {
    LO hinge = surf_hinge2hinge[surf_hinge];
    hinge_is_sharp[hinge] = (surf_hinge_angles[surf_hinge] >= sharp_angle);
  };
  parallel_for(nsurf_hinges, f, "classify_by_angles(is_sharp)");
  classify_hinges_by_sharpness(mesh, hinge_is_exposed, hinge_is_sharp);
  if (dim == 2) return;
  finalize_classification(mesh);
}